

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
               (DecimalCastData<long> *state,int32_t exponent)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  StoreType_conflict1 SVar9;
  
  uVar7 = 0;
  uVar3 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar3 = uVar7;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar7 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar3 - exponent == 0 || (int)uVar3 < exponent) {
      uVar7 = exponent - uVar3;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar3 - exponent);
    }
  }
  bVar2 = Finalize<duckdb::DecimalCastData<long>,false>(state);
  if (bVar2) {
    if ((int)uVar7 < 0) {
      lVar8 = (long)(int)uVar7;
      lVar1 = state->result;
      do {
        lVar6 = lVar1;
        lVar8 = lVar8 + 1;
        lVar1 = lVar6 / 10;
        if (lVar6 + 9U < 0x13) break;
      } while (lVar8 != 0);
      state->result = lVar1;
      bVar2 = true;
      if (4 < lVar6 % 10) {
        state->result = lVar1 + 1;
      }
    }
    else {
      bVar2 = true;
      if (uVar7 != 0) {
        uVar4 = (ulong)uVar7;
        bVar5 = state->digit_count;
        SVar9 = state->result;
        do {
          if (SVar9 == 0) {
            SVar9 = 0;
          }
          else {
            if ((uint)state->width - (uint)state->scale == (uint)bVar5) goto LAB_002aabd9;
            bVar5 = bVar5 + 1;
            state->digit_count = bVar5;
            if (0xccccccccccccccc < SVar9) goto LAB_002aabd9;
            SVar9 = SVar9 * 10;
            state->result = SVar9;
          }
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
    }
  }
  else {
LAB_002aabd9:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}